

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulnerabilitytocsv.cpp
# Opt level: O1

void help(void)

{
  fwrite("-h help\n-i use index file (no zip input)\n-z zip input\n-s skipheader\n-v version\n",0x4f
         ,1,_stderr);
  return;
}

Assistant:

void help()
{
	fprintf(stderr, 
		"-h help\n"
		"-i use index file (no zip input)\n"
		"-z zip input\n"
		"-s skipheader\n"
		"-v version\n"
	);
}